

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O0

void ckh_pointer_hash(void *key,size_t *r_hash)

{
  undefined8 in_RSI;
  size_t in_RDI;
  anon_union_8_2_9473010e u;
  
  hash(u.v,in_RDI,(uint32_t)((ulong)in_RSI >> 0x20),(size_t *)in_RDI);
  return;
}

Assistant:

void
ckh_pointer_hash(const void *key, size_t r_hash[2]) {
	union {
		const void	*v;
		size_t		i;
	} u;

	assert(sizeof(u.v) == sizeof(u.i));
	u.v = key;
	hash(&u.i, sizeof(u.i), 0xd983396eU, r_hash);
}